

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

string * __thiscall
cmLocalGenerator::CreateSafeUniqueObjectFileName(cmLocalGenerator *this,string *sin,string *dir_max)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  __type _Var3;
  size_type dir_len;
  ostream *poVar4;
  ulong uVar5;
  pointer ppVar6;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar7;
  __enable_if_t<is_constructible<value_type,_pair<const_basic_string<char>,_basic_string<char>_>_&>::value,_pair<iterator,_bool>_>
  _Var8;
  undefined1 local_350 [8];
  value_type e;
  undefined1 local_2f0 [8];
  ostringstream m;
  _Self local_158;
  _Base_ptr local_150;
  string local_148 [8];
  string sssin;
  char rpstr [100];
  allocator<char> local_b1;
  int cc;
  bool done;
  char local_8a [2];
  char *local_88;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  char local_72 [2];
  char *local_70;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  undefined1 local_50 [8];
  string ssin;
  _Self local_28;
  iterator it;
  string *dir_max_local;
  string *sin_local;
  cmLocalGenerator *this_local;
  
  it._M_node = (_Base_ptr)dir_max;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->UniqueObjectNamesMap,sin);
  ssin.field_2._8_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->UniqueObjectNamesMap);
  bVar1 = std::operator==(&local_28,(_Self *)((long)&ssin.field_2 + 8));
  if (bVar1) {
    std::__cxx11::string::string((string *)local_50,(string *)sin);
    std::__cxx11::string::find_first_not_of((char)(string *)local_50,0x2f);
    std::__cxx11::string::erase((ulong)local_50,0);
    local_68._M_current = (char *)std::__cxx11::string::begin();
    local_70 = (char *)std::__cxx11::string::end();
    local_72[1] = 0x3a;
    local_72[0] = '_';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (local_68,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )local_70,local_72 + 1,local_72);
    cmsys::SystemTools::ReplaceString((string *)local_50,"../","__/");
    local_80._M_current = (char *)std::__cxx11::string::begin();
    local_88 = (char *)std::__cxx11::string::end();
    local_8a[1] = 0x20;
    local_8a[0] = '_';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (local_80,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )local_88,local_8a + 1,local_8a);
    this_00 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cc,"CMAKE_MANGLE_OBJECT_FILE_NAMES",&local_b1);
    bVar1 = cmMakefile::IsOn(this_00,(string *)&cc);
    std::__cxx11::string::~string((string *)&cc);
    std::allocator<char>::~allocator(&local_b1);
    if (bVar1) {
      sprintf(sssin.field_2._M_local_buf + 8,"_p_");
      cmsys::SystemTools::ReplaceString((string *)local_50,"+",sssin.field_2._M_local_buf + 8);
      std::__cxx11::string::string(local_148,(string *)sin);
      while( true ) {
        bVar1 = true;
        local_150 = (_Base_ptr)
                    std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::begin(&this->UniqueObjectNamesMap);
        local_28._M_node = local_150;
        while( true ) {
          local_158._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::end(&this->UniqueObjectNamesMap);
          bVar2 = std::operator!=(&local_28,&local_158);
          if (!bVar2) break;
          ppVar6 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator->(&local_28);
          _Var3 = std::operator==(&ppVar6->second,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_50);
          if (_Var3) {
            bVar1 = false;
          }
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator++(&local_28);
        }
        if (bVar1) break;
        std::__cxx11::string::operator=(local_148,(string *)local_50);
        cmsys::SystemTools::ReplaceString((string *)local_50,"_p_",sssin.field_2._M_local_buf + 8);
        sprintf(sssin.field_2._M_local_buf + 8,"_p%d_");
      }
      std::__cxx11::string::~string(local_148);
    }
    dir_len = std::__cxx11::string::size();
    bVar1 = cmLocalGeneratorCheckObjectName((string *)local_50,dir_len,this->ObjectPathMax);
    if ((!bVar1) &&
       (pVar7 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert(&this->ObjectMaxPathViolations,(value_type *)it._M_node),
       ((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f0);
      poVar4 = std::operator<<((ostream *)local_2f0,"The object file directory\n");
      poVar4 = std::operator<<(poVar4,"  ");
      poVar4 = std::operator<<(poVar4,(string *)it._M_node);
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,"has ");
      uVar5 = std::__cxx11::string::size();
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar5);
      poVar4 = std::operator<<(poVar4," characters.  ");
      poVar4 = std::operator<<(poVar4,"The maximum full path to an object file is ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->ObjectPathMax);
      poVar4 = std::operator<<(poVar4," characters ");
      poVar4 = std::operator<<(poVar4,"(see CMAKE_OBJECT_PATH_MAX).  ");
      poVar4 = std::operator<<(poVar4,"Object file\n");
      poVar4 = std::operator<<(poVar4,"  ");
      poVar4 = std::operator<<(poVar4,(string *)local_50);
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,"cannot be safely placed under this directory.  ");
      std::operator<<(poVar4,"The build may not work correctly.");
      std::__cxx11::ostringstream::str();
      IssueMessage(this,WARNING,(string *)((long)&e.second.field_2 + 8));
      std::__cxx11::string::~string((string *)(e.second.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f0);
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_350,sin,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
    _Var8 = std::
            map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::insert<std::pair<std::__cxx11::string_const,std::__cxx11::string>&>
                      ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&this->UniqueObjectNamesMap,
                       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_350);
    local_28._M_node = (_Base_ptr)_Var8.first._M_node;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_350);
    std::__cxx11::string::~string((string *)local_50);
  }
  ppVar6 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator->(&local_28);
  return &ppVar6->second;
}

Assistant:

std::string& cmLocalGenerator::CreateSafeUniqueObjectFileName(
  const std::string& sin, std::string const& dir_max)
{
  // Look for an existing mapped name for this object file.
  std::map<std::string, std::string>::iterator it =
    this->UniqueObjectNamesMap.find(sin);

  // If no entry exists create one.
  if (it == this->UniqueObjectNamesMap.end()) {
    // Start with the original name.
    std::string ssin = sin;

    // Avoid full paths by removing leading slashes.
    ssin.erase(0, ssin.find_first_not_of('/'));

    // Avoid full paths by removing colons.
    std::replace(ssin.begin(), ssin.end(), ':', '_');

    // Avoid relative paths that go up the tree.
    cmSystemTools::ReplaceString(ssin, "../", "__/");

    // Avoid spaces.
    std::replace(ssin.begin(), ssin.end(), ' ', '_');

    // Mangle the name if necessary.
    if (this->Makefile->IsOn("CMAKE_MANGLE_OBJECT_FILE_NAMES")) {
      bool done;
      int cc = 0;
      char rpstr[100];
      sprintf(rpstr, "_p_");
      cmSystemTools::ReplaceString(ssin, "+", rpstr);
      std::string sssin = sin;
      do {
        done = true;
        for (it = this->UniqueObjectNamesMap.begin();
             it != this->UniqueObjectNamesMap.end(); ++it) {
          if (it->second == ssin) {
            done = false;
          }
        }
        if (done) {
          break;
        }
        sssin = ssin;
        cmSystemTools::ReplaceString(ssin, "_p_", rpstr);
        sprintf(rpstr, "_p%d_", cc++);
      } while (!done);
    }

#if defined(CM_LG_ENCODE_OBJECT_NAMES)
    if (!cmLocalGeneratorCheckObjectName(ssin, dir_max.size(),
                                         this->ObjectPathMax)) {
      // Warn if this is the first time the path has been seen.
      if (this->ObjectMaxPathViolations.insert(dir_max).second) {
        std::ostringstream m;
        /* clang-format off */
        m << "The object file directory\n"
          << "  " << dir_max << "\n"
          << "has " << dir_max.size() << " characters.  "
          << "The maximum full path to an object file is "
          << this->ObjectPathMax << " characters "
          << "(see CMAKE_OBJECT_PATH_MAX).  "
          << "Object file\n"
          << "  " << ssin << "\n"
          << "cannot be safely placed under this directory.  "
          << "The build may not work correctly.";
        /* clang-format on */
        this->IssueMessage(MessageType::WARNING, m.str());
      }
    }
#else
    (void)dir_max;
#endif

    // Insert the newly mapped object file name.
    std::map<std::string, std::string>::value_type e(sin, ssin);
    it = this->UniqueObjectNamesMap.insert(e).first;
  }

  // Return the map entry.
  return it->second;
}